

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int local_30;
  int local_2c;
  int a;
  int b;
  
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_6e4);
  local_30 = 0;
  std::istream::operator>>((istream *)&std::cin,&local_30);
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_707);
  local_2c = 0;
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_71d);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c + local_30);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_733);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30 - local_2c);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_749);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30 / local_2c);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_75f);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30 % local_2c);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_775);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c * local_30);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_77f);
  local_30 = local_30 + 1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_795);
  iVar1 = local_30;
  local_30 = local_30 + 1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_7ab);
  local_2c = local_2c + -1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_7b5);
  iVar1 = local_2c;
  local_2c = local_2c + -1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main() {
    cout << "Введите число A: ";
    int a = 0; // Объявление и инициализация переменной
    cin >> a; // Мы загружаем данные в переменную a
    cout << "Введите число B (кроме 0): ";
    int b = 0; // Объявление и инициализация переменной b
    cin >> b; // Мы загружаем данные в переменную Ь
    cout << "Результат сложения  " << a + b << endl; // Сложение
    cout << "Результат вычитания: " << a - b << endl; // Вычитание
    cout << "Результат деления: " << a / b << endl; // Деление
    cout << "Остаток от деления: " << a % b << endl; // Остаток от деления
    cout << "Результат умножения: " << a * b << endl; // Умножение
    cout << "Инкремент префиксный переменной a: " << ++a << endl; // Инкремент префиксный
    cout << "Инкремент суффиксный (постфиксный) переменной a: " << a++ << endl; // Инкремент суффиксный (постфиксный)
    cout << "Декремент префиксный переменной b: " << --b << endl; // Декремент префиксный
    cout << "Декремент суффиксный (постфиксный) переменной b: " << b-- << endl; // Декремент суффиксный (постфиксный)

    return 0;
}